

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O1

void __thiscall ControlParser::parseControlLine(ControlParser *this,string *line,Network *network)

{
  bool bVar1;
  InputError *pIVar2;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string keyword;
  
  this->controlType = -1;
  this->link = (Link *)0x0;
  this->linkStatus = 2;
  this->nodeSetting = 0.0;
  this->linkSetting = 0.0;
  this->node = (Node *)0x0;
  this->levelType = 0;
  this->timeSetting = -1;
  std::ios::clear((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  local_70 = (undefined1  [8])&keyword._M_string_length;
  std::operator>>((istream *)this,(string *)local_70);
  parseLinkSetting(this,network);
  std::operator>>((istream *)this,(string *)local_70);
  std::operator>>((istream *)this,(string *)local_70);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    InputError::InputError(pIVar2,2,&local_b0);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&keyword.field_2 + 8),"NODE","");
  bVar1 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
  if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)keyword.field_2._8_8_);
  }
  if (bVar1) {
    parseLevelSetting(this,network);
  }
  else {
    keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&keyword.field_2 + 8),"TIME","");
    bVar1 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
    if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)keyword.field_2._8_8_);
    }
    if (bVar1) {
      parseTimeSetting(this);
    }
    else {
      keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&keyword.field_2 + 8),"CLOCKTIME","");
      bVar1 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
      if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
        operator_delete((void *)keyword.field_2._8_8_);
      }
      if (!bVar1) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_70,keyword._M_dataplus._M_p + (long)local_70);
        InputError::InputError(pIVar2,3,&local_90);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      parseTimeOfDaySetting(this);
    }
  }
  createControl(this,network);
  if (local_70 != (undefined1  [8])&keyword._M_string_length) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void ControlParser::parseControlLine(string& line, Network* network)

// Formats are:
//   LINK id OPEN/CLOSED/setting IF NODE id ABOVE/BELOW value
//   . . .                       AT TIME time
//   . . .                       AT CLOCKTIME time  (AM/PM)
// where time is in decimal hours or hrs:min:sec.

{
    // ... initialize
    initializeControlSettings();

    // ... skip over LINK keyword
    sin.clear();
    sin.str(line);
    string keyword;
    sin >> keyword;

    // ... get settings for link being controlled
    parseLinkSetting(network);

    //... skip next keyword
    sin >> keyword;

    //... get next keyword
    sin >> keyword;
    if (sin.eof()) throw InputError(InputError::TOO_FEW_ITEMS, "");

    //... get node control level if keyword == NODE
    if ( Utilities::match(keyword, w_NODE) ) parseLevelSetting(network);

    //... get control time if keyword == TIME
    else if ( Utilities::match(keyword, w_TIME) ) parseTimeSetting();

    //... get control time of day if keyword == CLOCKTIME
    else if ( Utilities::match(keyword, w_CLOCKTIME) ) parseTimeOfDaySetting();

    else throw InputError(InputError::INVALID_KEYWORD, keyword);

    //... create the control
    createControl(network);
}